

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QStringList * __thiscall QString::split(QString *this,QRegularExpression *re,SplitBehavior behavior)

{
  long lVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  offset_in_QRegularExpression_to_subr in_stack_00000020;
  QRegularExpression *in_stack_00000030;
  QString *in_stack_00000038;
  offset_in_QRegularExpression_to_subr matchingFunction;
  SplitBehavior in_stack_000000cc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QConstOverload<QString_const&,long_long,QRegularExpression::MatchType,QFlags<QRegularExpression::MatchOption>>
  ::operator()((QConstOverload<QString_const&,long_long,QRegularExpression::MatchType,QFlags<QRegularExpression::MatchOption>>
                *)&
                  qOverload<QString_const&,long_long,QRegularExpression::MatchType,QFlags<QRegularExpression::MatchOption>>
               ,(offset_in_QRegularExpression_to_subr)QRegularExpression::globalMatch);
  (anonymous_namespace)::
  splitString<QList<QString>,QString,QRegularExpressionMatchIterator(QRegularExpression::*)(QString_const&,long_long,QRegularExpression::MatchType,QFlags<QRegularExpression::MatchOption>)const>
            (in_stack_00000038,in_stack_00000030,in_stack_00000020,in_stack_000000cc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QString::split(const QRegularExpression &re, Qt::SplitBehavior behavior) const
{
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
    const auto matchingFunction = qOverload<const QString &, qsizetype, QRegularExpression::MatchType, QRegularExpression::MatchOptions>(&QRegularExpression::globalMatch);
#else
    const auto matchingFunction = &QRegularExpression::globalMatch;
#endif
    return splitString<QStringList>(*this,
                                    re,
                                    matchingFunction,
                                    behavior);
}